

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Emb_ManComputeEigenvectors(Emb_Man_t *p,int nDims,int nSols)

{
  float *pVec;
  float *pfVar1;
  float **ppfVar2;
  float *pfVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  float Res_1;
  float Res;
  float fVar11;
  
  if (nDims <= nSols) {
    __assert_fail("nSols < nDims",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x552,"void Emb_ManComputeEigenvectors(Emb_Man_t *, int, int)");
  }
  if (0 < nSols) {
    pVec = p->pEigen[nSols];
    uVar8 = (ulong)(uint)nDims;
    uVar5 = 0;
    do {
      pfVar1 = p->pEigen[uVar5];
      if (0 < nDims) {
        uVar9 = 0;
        do {
          uVar4 = Gia_ManRandom(0);
          pVec[uVar9] = (float)uVar4;
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      Emb_ManVecNormal(pVec,nDims);
      uVar4 = 0;
      do {
        if (0 < nDims) {
          uVar9 = 0;
          do {
            pfVar1[uVar9] = pVec[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
        }
        if (uVar5 != 0) {
          ppfVar2 = p->pEigen;
          uVar9 = 0;
          do {
            if (0 < nDims) {
              pfVar3 = ppfVar2[uVar9];
              uVar6 = 0;
              do {
                fVar11 = 0.0;
                uVar7 = 0;
                do {
                  fVar11 = fVar11 + pfVar1[uVar7] * pfVar3[uVar7];
                  uVar7 = uVar7 + 1;
                } while (uVar8 != uVar7);
                pVec[uVar6] = pfVar1[uVar6] - pfVar3[uVar6] * fVar11;
                uVar6 = uVar6 + 1;
              } while (uVar6 != uVar8);
              if (0 < nDims) {
                uVar6 = 0;
                do {
                  pfVar1[uVar6] = pVec[uVar6];
                  uVar6 = uVar6 + 1;
                } while (uVar8 != uVar6);
              }
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar5);
        }
        if (nDims < 1) {
          Emb_ManVecNormal(pVec,nDims);
LAB_00687de8:
          bVar10 = true;
        }
        else {
          ppfVar2 = p->pMatr;
          uVar9 = 0;
          do {
            fVar11 = 0.0;
            uVar6 = 0;
            do {
              fVar11 = fVar11 + ppfVar2[uVar9][uVar6] * pfVar1[uVar6];
              uVar6 = uVar6 + 1;
            } while (uVar8 != uVar6);
            pVec[uVar9] = fVar11;
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar8);
          Emb_ManVecNormal(pVec,nDims);
          if (nDims < 1) goto LAB_00687de8;
          fVar11 = 0.0;
          uVar9 = 0;
          do {
            fVar11 = fVar11 + pVec[uVar9] * pfVar1[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar8 != uVar9);
          bVar10 = fVar11 < 0.999;
        }
      } while ((bVar10) && (bVar10 = uVar4 < 99, uVar4 = uVar4 + 1, bVar10));
      if (0 < nDims) {
        uVar9 = 0;
        do {
          pfVar1[uVar9] = pVec[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar8 != uVar9);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)nSols);
  }
  return;
}

Assistant:

void Emb_ManComputeEigenvectors( Emb_Man_t * p, int nDims, int nSols )
{
    float * pVecUiHat, * pVecUi;
    int i, j, k;
    assert( nSols < nDims );
    pVecUiHat = p->pEigen[nSols];
    for ( i = 0; i < nSols; i++ )
    {
        pVecUi = p->pEigen[i];
        Emb_ManVecRandom( pVecUiHat, nDims );
        Emb_ManVecNormal( pVecUiHat, nDims );
        k = 0;
        do {
            k++;
            Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
            for ( j = 0; j < i; j++ )
            {
                Emb_ManVecOrthogonolizeOne( p->pEigen[j], pVecUi, nDims, pVecUiHat );
                Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
            }
            Emb_ManVecMultiply( p->pMatr, pVecUi, nDims, pVecUiHat );
            Emb_ManVecNormal( pVecUiHat, nDims );
        } while ( Emb_ManVecMultiplyOne( pVecUiHat, pVecUi, nDims ) < 0.999 && k < 100 );
        Emb_ManVecCopyOne( pVecUi, pVecUiHat, nDims );
//        printf( "Converged after %d iterations.\n", k );
    }
}